

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

void __thiscall
QTableView::selectionChanged(QTableView *this,QItemSelection *selected,QItemSelection *deselected)

{
  long lVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long *plVar8;
  uint uVar9;
  long in_FS_OFFSET;
  QArrayData *local_58;
  uint *local_50;
  QTableView *pQStack_48;
  int local_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  cVar4 = QAccessible::isActive();
  if (cVar4 != '\0') {
    QItemSelection::indexes();
    if (pQStack_48 == (QTableView *)0x0) {
      uVar6 = 0xffffffff;
      plVar8 = (long *)0x0;
      uVar7 = 0xffffffff;
    }
    else {
      uVar6 = *local_50;
      uVar7 = local_50[1];
      plVar8 = *(long **)(local_50 + 4);
    }
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,0x18,0x10);
      }
    }
    if (plVar8 != (long *)0x0 && -1 < (int)(uVar6 | uVar7)) {
      lVar2 = *(long *)(lVar1 + 0x588);
      lVar3 = *(long *)(lVar1 + 0x580);
      local_58 = (QArrayData *)0xffffffffffffffff;
      local_50 = (uint *)0x0;
      pQStack_48 = (QTableView *)0x0;
      iVar5 = (**(code **)(*plVar8 + 0x80))(plVar8,&local_58);
      uVar9 = (uint)(lVar2 != 0);
      local_58 = (QArrayData *)QFont::strikeOut;
      local_50 = (uint *)0xaaaaaaaa00008007;
      _local_40 = CONCAT44(0xaaaaaaaa,
                           uVar7 + uVar9 + (iVar5 + uVar9) * ((uVar6 + 1) - (uint)(lVar3 == 0)));
      pQStack_48 = this;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_58);
    }
    QItemSelection::indexes();
    if (pQStack_48 == (QTableView *)0x0) {
      uVar6 = 0xffffffff;
      plVar8 = (long *)0x0;
      uVar7 = 0xffffffff;
    }
    else {
      uVar6 = *local_50;
      uVar7 = local_50[1];
      plVar8 = *(long **)(local_50 + 4);
    }
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,0x18,0x10);
      }
    }
    if (plVar8 != (long *)0x0 && -1 < (int)(uVar6 | uVar7)) {
      lVar2 = *(long *)(lVar1 + 0x588);
      lVar1 = *(long *)(lVar1 + 0x580);
      local_58 = (QArrayData *)0xffffffffffffffff;
      local_50 = (uint *)0x0;
      pQStack_48 = (QTableView *)0x0;
      iVar5 = (**(code **)(*plVar8 + 0x80))(plVar8,&local_58);
      uVar9 = (uint)(lVar2 != 0);
      local_58 = (QArrayData *)QFont::strikeOut;
      local_50 = (uint *)0xaaaaaaaa00008008;
      _local_40 = CONCAT44(0xaaaaaaaa,
                           uVar7 + uVar9 + (iVar5 + uVar9) * ((uVar6 + 1) - (uint)(lVar1 == 0)));
      pQStack_48 = this;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_58);
    }
  }
  QAbstractItemView::selectionChanged((QAbstractItemView *)this,selected,deselected);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableView::selectionChanged(const QItemSelection &selected,
                                  const QItemSelection &deselected)
{
    Q_D(QTableView);
    Q_UNUSED(d);
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        // ### does not work properly for selection ranges.
        QModelIndex sel = selected.indexes().value(0);
        if (sel.isValid()) {
            int entry = d->accessibleTable2Index(sel);
            QAccessibleEvent event(this, QAccessible::SelectionAdd);
            event.setChild(entry);
            QAccessible::updateAccessibility(&event);
        }
        QModelIndex desel = deselected.indexes().value(0);
        if (desel.isValid()) {
            int entry = d->accessibleTable2Index(desel);
            QAccessibleEvent event(this, QAccessible::SelectionRemove);
            event.setChild(entry);
            QAccessible::updateAccessibility(&event);
        }
    }
#endif
    QAbstractItemView::selectionChanged(selected, deselected);
}